

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O1

void G_SerializeLevel(FSerializer *arc,bool hubload)

{
  uint uVar1;
  FSerializer *pFVar2;
  subsector_t **ppsVar3;
  subsector_t **ss;
  long lVar4;
  int i_1;
  long lVar5;
  undefined8 *puVar6;
  undefined1 auVar7 [16];
  int i;
  BYTE chk [16];
  int local_4c;
  undefined1 local_48 [16];
  
  local_4c = level.totaltime;
  if (arc->w == (FWriter *)0x0) {
    local_48 = (undefined1  [16])0x0;
    FSerializer::Array<unsigned_char>(arc,"checksum",local_48,0x10,false);
    uVar1 = FSerializer::GetSize(arc,"linedefs");
    if (uVar1 == numlines) {
      uVar1 = FSerializer::GetSize(arc,"sidedefs");
      if (uVar1 == numsides) {
        uVar1 = FSerializer::GetSize(arc,"sectors");
        if (uVar1 == numsectors) {
          uVar1 = FSerializer::GetSize(arc,"polyobjs");
          if ((uVar1 == po_NumPolyobjs) &&
             (auVar7[0] = -(level.md5[0] == local_48[0]), auVar7[1] = -(level.md5[1] == local_48[1])
             , auVar7[2] = -(level.md5[2] == local_48[2]),
             auVar7[3] = -(level.md5[3] == local_48[3]), auVar7[4] = -(level.md5[4] == local_48[4]),
             auVar7[5] = -(level.md5[5] == local_48[5]), auVar7[6] = -(level.md5[6] == local_48[6]),
             auVar7[7] = -(level.md5[7] == local_48[7]), auVar7[8] = -(level.md5[8] == local_48[8]),
             auVar7[9] = -(level.md5[9] == local_48[9]),
             auVar7[10] = -(level.md5[10] == local_48[10]),
             auVar7[0xb] = -(level.md5[0xb] == local_48[0xb]),
             auVar7[0xc] = -(level.md5[0xc] == local_48[0xc]),
             auVar7[0xd] = -(level.md5[0xd] == local_48[0xd]),
             auVar7[0xe] = -(level.md5[0xe] == local_48[0xe]),
             auVar7[0xf] = -(level.md5[0xf] == local_48[0xf]),
             (ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar7[0xf] >> 7) << 0xf) == 0xffff)) goto LAB_00440466;
        }
      }
    }
    I_Error("Savegame is from a different level");
  }
  else {
    FSerializer::Array<unsigned_char>(arc,"checksum",level.md5,0x10,false);
  }
LAB_00440466:
  Serialize(arc,"saveversion",&SaveVersion,(int32_t *)0x0);
  (*Renderer->_vptr_FRenderer[9])(Renderer,arc);
  if (arc->r != (FReader *)0x0) {
    DThinker::DestroyAllThinkers();
    FInterpolator::ClearInterpolations(&interpolator);
    FSerializer::ReadObjects(arc,hubload);
  }
  pFVar2 = Serialize(arc,"level.flags",&level.flags,(uint32_t *)0x0);
  pFVar2 = Serialize(pFVar2,"level.flags2",&level.flags2,(uint32_t *)0x0);
  pFVar2 = Serialize(pFVar2,"level.fadeto",&level.fadeto,(uint32_t *)0x0);
  pFVar2 = Serialize(pFVar2,"level.found_secrets",&level.found_secrets,(int32_t *)0x0);
  pFVar2 = Serialize(pFVar2,"level.found_items",&level.found_items,(int32_t *)0x0);
  pFVar2 = Serialize(pFVar2,"level.killed_monsters",&level.killed_monsters,(int32_t *)0x0);
  pFVar2 = Serialize(pFVar2,"level.total_secrets",&level.total_secrets,(int32_t *)0x0);
  pFVar2 = Serialize(pFVar2,"level.total_items",&level.total_items,(int32_t *)0x0);
  pFVar2 = Serialize(pFVar2,"level.total_monsters",&level.total_monsters,(int32_t *)0x0);
  pFVar2 = Serialize(pFVar2,"level.gravity",&level.gravity,(double *)0x0);
  pFVar2 = Serialize(pFVar2,"level.aircontrol",&level.aircontrol,(double *)0x0);
  pFVar2 = Serialize(pFVar2,"level.teamdamage",&level.teamdamage,(double *)0x0);
  pFVar2 = Serialize(pFVar2,"level.maptime",&level.maptime,(int32_t *)0x0);
  pFVar2 = Serialize(pFVar2,"level.totaltime",&local_4c,(int32_t *)0x0);
  pFVar2 = Serialize(pFVar2,"level.skytexture1",&level.skytexture1,(FTextureID *)0x0);
  Serialize(pFVar2,"level.skytexture2",&level.skytexture2,(FTextureID *)0x0);
  if (!hubload) {
    level.totaltime = local_4c;
  }
  if (arc->r != (FReader *)0x0) {
    sky1texture = level.skytexture1;
    sky2texture = level.skytexture2;
    R_InitSkyMap();
    G_AirControlChanged();
  }
  FBehavior::StaticSerializeModuleStates(arc);
  FSerializer::Array<line_t>(arc,"linedefs",lines,loadlines.Array,numlines,false);
  FSerializer::Array<side_t>(arc,"sidedefs",sides,loadsides.Array,numsides,false);
  FSerializer::Array<sector_t>(arc,"sectors",sectors,loadsectors.Array,numsectors,false);
  Serialize<zone_t,zone_t>(arc,"zones",&Zones,(TArray<zone_t,_zone_t> *)0x0);
  Serialize<FLinePortal,FLinePortal>
            (arc,"lineportals",&linePortals,(TArray<FLinePortal,_FLinePortal> *)0x0);
  Serialize<FSectorPortal,FSectorPortal>
            (arc,"sectorportals",&sectorPortals,(TArray<FSectorPortal,_FSectorPortal> *)0x0);
  if (arc->r != (FReader *)0x0) {
    P_CollectLinkedPortals();
  }
  DThinker::SerializeThinkers(arc,!hubload);
  ppsVar3 = (subsector_t **)(ulong)(uint)po_NumPolyobjs;
  FSerializer::Array<FPolyObj>(arc,"polyobjs",polyobjs,po_NumPolyobjs,false);
  Serialize(arc,"subsectors",ss,ppsVar3);
  DBaseStatusBar::SerializeMessages(StatusBar,arc);
  AM_SerializeMarkers(arc);
  FRemapTable::StaticSerializeTranslations(arc);
  FCanvasTextureInfo::Serialize(arc);
  P_SerializePlayers(arc,hubload);
  P_SerializeSounds(arc);
  if (arc->r != (FReader *)0x0) {
    if (0 < numsectors) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        P_Recalculate3DFloors((sector_t_conflict *)((long)&sectors->planes[0].xform.xOffs + lVar5));
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0x218;
      } while (lVar4 < numsectors);
    }
    puVar6 = &players;
    lVar4 = 0;
    do {
      if ((playeringame[lVar4] == true) && ((APlayerPawn *)*puVar6 != (APlayerPawn *)0x0)) {
        APlayerPawn::SetupWeaponSlots((APlayerPawn *)*puVar6);
      }
      lVar4 = lVar4 + 1;
      puVar6 = puVar6 + 0x54;
    } while (lVar4 != 8);
  }
  (*Renderer->_vptr_FRenderer[10])(Renderer,arc);
  return;
}

Assistant:

void G_SerializeLevel(FSerializer &arc, bool hubload)
{
	int i = level.totaltime;

	if (arc.isWriting())
	{
		arc.Array("checksum", level.md5, 16);
	}
	else
	{
		// prevent bad things from happening by doing a check on the size of level arrays and the map's entire checksum.
		// The old code happily tried to load savegames with any mismatch here, often causing meaningless errors
		// deep down in the deserializer or just a crash if the few insufficient safeguards were not triggered.
		BYTE chk[16] = { 0 };
		arc.Array("checksum", chk, 16);
		if (arc.GetSize("linedefs") != (unsigned)numlines ||
			arc.GetSize("sidedefs") != (unsigned)numsides ||
			arc.GetSize("sectors") != (unsigned)numsectors ||
			arc.GetSize("polyobjs") != (unsigned)po_NumPolyobjs ||
			memcmp(chk, level.md5, 16))
		{
			I_Error("Savegame is from a different level");
		}
	}
	arc("saveversion", SaveVersion);

	Renderer->StartSerialize(arc);
	if (arc.isReading())
	{
		DThinker::DestroyAllThinkers();
		interpolator.ClearInterpolations();
		arc.ReadObjects(hubload);
	}

	arc("level.flags", level.flags)
		("level.flags2", level.flags2)
		("level.fadeto", level.fadeto)
		("level.found_secrets", level.found_secrets)
		("level.found_items", level.found_items)
		("level.killed_monsters", level.killed_monsters)
		("level.total_secrets", level.total_secrets)
		("level.total_items", level.total_items)
		("level.total_monsters", level.total_monsters)
		("level.gravity", level.gravity)
		("level.aircontrol", level.aircontrol)
		("level.teamdamage", level.teamdamage)
		("level.maptime", level.maptime)
		("level.totaltime", i)
		("level.skytexture1", level.skytexture1)
		("level.skytexture2", level.skytexture2);

	// Hub transitions must keep the current total time
	if (!hubload)
		level.totaltime = i;

	if (arc.isReading())
	{
		sky1texture = level.skytexture1;
		sky2texture = level.skytexture2;
		R_InitSkyMap();
		G_AirControlChanged();
	}



	// fixme: This needs to ensure it reads from the correct place. Should be one once there's enough of this code converted to JSON

	FBehavior::StaticSerializeModuleStates(arc);
	// The order here is important: First world state, then portal state, then thinkers, and last polyobjects.
	arc.Array("linedefs", lines, &loadlines[0], numlines);
	arc.Array("sidedefs", sides, &loadsides[0], numsides);
	arc.Array("sectors", sectors, &loadsectors[0], numsectors);
	arc("zones", Zones);
	arc("lineportals", linePortals);
	arc("sectorportals", sectorPortals);
	if (arc.isReading()) P_CollectLinkedPortals();

	DThinker::SerializeThinkers(arc, !hubload);
	arc.Array("polyobjs", polyobjs, po_NumPolyobjs);
	arc("subsectors", subsectors);
	StatusBar->SerializeMessages(arc);
	AM_SerializeMarkers(arc);
	FRemapTable::StaticSerializeTranslations(arc);
	FCanvasTextureInfo::Serialize(arc);
	P_SerializePlayers(arc, hubload);
	P_SerializeSounds(arc);

	if (arc.isReading())
	{
		for (int i = 0; i < numsectors; i++)
		{
			P_Recalculate3DFloors(&sectors[i]);
		}
		for (int i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i] && players[i].mo != NULL)
			{
				players[i].mo->SetupWeaponSlots();
			}
		}
	}
	Renderer->EndSerialize(arc);

}